

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLKinematicsIntermediateData.h
# Opt level: O2

void __thiscall
COLLADASaxFWL::KinematicsModel::addBaseLink(KinematicsModel *this,KinematicLink *baseLink)

{
  KinematicLink *local_8;
  
  local_8 = baseLink;
  std::vector<COLLADASaxFWL::KinematicLink_*,_std::allocator<COLLADASaxFWL::KinematicLink_*>_>::
  push_back(&this->mBaseLinks,&local_8);
  return;
}

Assistant:

void addBaseLink( KinematicLink* baseLink ) { mBaseLinks.push_back(baseLink); }